

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_dead_code.hpp
# Opt level: O2

bool __thiscall
optimization::remove_dead_code::Remove_Dead_Code::remove_dead_code
          (Remove_Dead_Code *this,shared_ptr<optimization::livevar_analyse::Block_Live_Var> *blv,
          BasicBlk *block,
          map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
          *vartable)

{
  element_type *peVar1;
  long lVar2;
  sharedPtrVariableSet *psVar3;
  element_type *peVar4;
  bool bVar5;
  int iVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  const_iterator __position;
  sharedPtrVariableSet *psVar9;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *puVar10;
  __shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var11;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *this_00;
  sharedPtrVariableSet tmp;
  VarId defvar;
  mapped_type defvariable;
  __shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
  local_78;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *local_68;
  key_type local_60;
  Variable local_50;
  
  std::
  __shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_78,
                 &(((blv->
                    super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->live_vars_out).
                  super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  puVar10 = (block->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &block->inst;
  bVar5 = false;
  local_68 = vartable;
  while (puVar10 !=
         (this_00->
         super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start) {
    local_60.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_60.id = ((puVar10[-1]._M_t.
                    super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                    .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest).id;
    pmVar7 = std::
             map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
             ::operator[](vartable,&local_60.id);
    mir::inst::Variable::Variable(&local_50,pmVar7);
    iVar6 = (*((local_50.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_Displayable)._vptr_Displayable[1])();
    __position._M_current = puVar10 + -1;
    if (iVar6 != 1) {
      iVar6 = (*((((__position._M_current)->_M_t).
                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t
                  .super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
                _vptr_Displayable[1])();
      if (iVar6 != 4) {
        iVar6 = (*((((__position._M_current)->_M_t).
                    super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                    .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                  super_Displayable)._vptr_Displayable[1])();
        if (iVar6 != 6) {
          iVar6 = (int)((ulong)((long)puVar10 -
                               (long)(this_00->
                                     super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 3);
          peVar1 = (blv->
                   super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          lVar2 = (long)(peVar1->instLiveVars).
                        super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          p_Var11 = (__shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                     *)(lVar2 + 0x10 + (long)(iVar6 + -1) * 0x10);
          if ((ulong)((long)(peVar1->instLiveVars).
                            super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - lVar2 >> 4) <=
              (ulong)(long)iVar6) {
            p_Var11 = &(peVar1->live_vars_out).
                       super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
            ;
          }
          std::
          __shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
          ::operator=(&local_78,p_Var11);
          sVar8 = std::
                  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  ::count(local_78._M_ptr,&local_60);
          if (sVar8 == 0) {
            __position._M_current =
                 (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 std::
                 vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ::erase(this_00,__position);
            peVar1 = (blv->
                     super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            std::
            vector<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::erase(&peVar1->instLiveVars,
                    (peVar1->instLiveVars).
                    super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (iVar6 + -1));
            livevar_analyse::Block_Live_Var::update
                      ((blv->
                       super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr,iVar6 + -2);
            bVar5 = true;
            vartable = local_68;
          }
        }
      }
    }
    puVar10 = __position._M_current;
    mir::inst::Variable::~Variable(&local_50);
  }
  std::
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  ::clear(&((((blv->
              super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->live_vars_in).
            super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr)->_M_t);
  peVar1 = (blv->
           super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  psVar3 = (peVar1->instLiveVars).
           super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar9 = &peVar1->live_vars_out;
  if ((peVar1->instLiveVars).
      super__Vector_base<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::allocator<std::shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar3) {
    psVar9 = psVar3;
  }
  peVar4 = (psVar9->
           super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  std::
  _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<mir::inst::VarId>>
            ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
              *)(peVar1->live_vars_in).
                super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,(peVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<mir::inst::VarId>)
             &(peVar4->_M_t)._M_impl.super__Rb_tree_header);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  return bVar5;
}

Assistant:

bool remove_dead_code(std::shared_ptr<livevar_analyse::Block_Live_Var> blv,
                        mir::inst::BasicBlk& block,
                        std::map<uint32_t, mir::inst::Variable>& vartable) {
    bool modify = false;
    auto tmp = blv->live_vars_out;
    for (auto riter = block.inst.rbegin(); riter != block.inst.rend();) {
      auto defvar = riter->get()->dest;
      auto defvariable = vartable[defvar.id];
      if (defvariable.ty->kind() == mir::types::TyKind::Void ||
          riter->get()->inst_kind() == mir::inst::InstKind::Store ||
          riter->get()->inst_kind() == mir::inst::InstKind::Call) {
        riter++;
        continue;
      }
      int idx = block.inst.rend() - riter - 1;
      if (idx + 1 >= blv->instLiveVars.size()) {  // remove the last code
        tmp = blv->live_vars_out;
      } else {
        tmp = *(blv->instLiveVars.begin() + idx + 1);
      }
      if (!tmp->count(defvar)) {
        riter = std::vector<std::unique_ptr<mir::inst::Inst>>::reverse_iterator(
            block.inst.erase((++riter).base()));
        blv->instLiveVars.erase(blv->instLiveVars.begin() + idx);
        // vartable.erase(defvar.id);
        blv->update(idx - 1);
        modify = true;
      } else {
        riter++;
      }
    }
    // if (modify) {
    //   build(live_vars_out, block);
    // }
    blv->live_vars_in->clear();
    if (blv->instLiveVars.size()) {
      blv->live_vars_in->insert(blv->instLiveVars[0]->begin(),
                                blv->instLiveVars[0]->end());
    } else {  // Maybe the block's codes are all dead
      blv->live_vars_in->insert(blv->live_vars_out->begin(),
                                blv->live_vars_out->end());
    }
    return modify;
  }